

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::BiDirectionalLSTMLayerParams::ByteSizeLong
          (BiDirectionalLSTMLayerParams *this)

{
  bool bVar1;
  int iVar2;
  reference pAVar3;
  reference value;
  uint64_t uVar4;
  size_t sVar5;
  long lVar6;
  int cached_size;
  LSTMWeightParams *msg_2;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  RepeatedPtrField<CoreML::Specification::LSTMWeightParams> *__range2_2;
  ActivationParams *msg_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  RepeatedPtrField<CoreML::Specification::ActivationParams> *__range2_1;
  ActivationParams *msg;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<CoreML::Specification::ActivationParams> *__range2;
  size_t sStack_18;
  uint32_t cached_has_bits;
  size_t total_size;
  BiDirectionalLSTMLayerParams *this_local;
  
  iVar2 = _internal_activationsforwardlstm_size(this);
  sStack_18 = (size_t)iVar2;
  __end2 = google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::begin
                     (&this->activationsforwardlstm_);
  msg = (ActivationParams *)
        google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::end
                  (&this->activationsforwardlstm_);
  while (bVar1 = google::protobuf::internal::
                 RepeatedPtrIterator<const_CoreML::Specification::ActivationParams>::operator!=
                           (&__end2,(iterator *)&msg), bVar1) {
    pAVar3 = google::protobuf::internal::
             RepeatedPtrIterator<const_CoreML::Specification::ActivationParams>::operator*(&__end2);
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::ActivationParams>(pAVar3);
    sStack_18 = sVar5 + sStack_18;
    google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::ActivationParams>::
    operator++(&__end2);
  }
  iVar2 = _internal_activationsbackwardlstm_size(this);
  sStack_18 = (long)iVar2 + sStack_18;
  __end2_1 = google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::begin
                       (&this->activationsbackwardlstm_);
  msg_1 = (ActivationParams *)
          google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::end
                    (&this->activationsbackwardlstm_);
  while (bVar1 = google::protobuf::internal::
                 RepeatedPtrIterator<const_CoreML::Specification::ActivationParams>::operator!=
                           (&__end2_1,(iterator *)&msg_1), bVar1) {
    pAVar3 = google::protobuf::internal::
             RepeatedPtrIterator<const_CoreML::Specification::ActivationParams>::operator*
                       (&__end2_1);
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::ActivationParams>(pAVar3);
    sStack_18 = sVar5 + sStack_18;
    google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::ActivationParams>::
    operator++(&__end2_1);
  }
  iVar2 = _internal_weightparams_size(this);
  sStack_18 = (long)iVar2 * 2 + sStack_18;
  __end2_2 = google::protobuf::RepeatedPtrField<CoreML::Specification::LSTMWeightParams>::begin
                       (&this->weightparams_);
  msg_2 = (LSTMWeightParams *)
          google::protobuf::RepeatedPtrField<CoreML::Specification::LSTMWeightParams>::end
                    (&this->weightparams_);
  while (bVar1 = google::protobuf::internal::
                 RepeatedPtrIterator<const_CoreML::Specification::LSTMWeightParams>::operator!=
                           (&__end2_2,(iterator *)&msg_2), bVar1) {
    value = google::protobuf::internal::
            RepeatedPtrIterator<const_CoreML::Specification::LSTMWeightParams>::operator*(&__end2_2)
    ;
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::LSTMWeightParams>(value);
    sStack_18 = sVar5 + sStack_18;
    google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::LSTMWeightParams>::
    operator++(&__end2_2);
  }
  bVar1 = _internal_has_params(this);
  if (bVar1) {
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::LSTMParams>(this->params_);
    sStack_18 = sVar5 + 1 + sStack_18;
  }
  uVar4 = _internal_inputvectorsize(this);
  if (uVar4 != 0) {
    uVar4 = _internal_inputvectorsize(this);
    sVar5 = google::protobuf::internal::WireFormatLite::UInt64SizePlusOne(uVar4);
    sStack_18 = sVar5 + sStack_18;
  }
  uVar4 = _internal_outputvectorsize(this);
  if (uVar4 != 0) {
    uVar4 = _internal_outputvectorsize(this);
    sVar5 = google::protobuf::internal::WireFormatLite::UInt64SizePlusOne(uVar4);
    sStack_18 = sVar5 + sStack_18;
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    lVar6 = std::__cxx11::string::size();
    sStack_18 = lVar6 + sStack_18;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_18);
  SetCachedSize(this,iVar2);
  return sStack_18;
}

Assistant:

size_t BiDirectionalLSTMLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.BiDirectionalLSTMLayerParams)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .CoreML.Specification.ActivationParams activationsForwardLSTM = 10;
  total_size += 1UL * this->_internal_activationsforwardlstm_size();
  for (const auto& msg : this->activationsforwardlstm_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated .CoreML.Specification.ActivationParams activationsBackwardLSTM = 11;
  total_size += 1UL * this->_internal_activationsbackwardlstm_size();
  for (const auto& msg : this->activationsbackwardlstm_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated .CoreML.Specification.LSTMWeightParams weightParams = 20;
  total_size += 2UL * this->_internal_weightparams_size();
  for (const auto& msg : this->weightparams_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // .CoreML.Specification.LSTMParams params = 15;
  if (this->_internal_has_params()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
        *params_);
  }

  // uint64 inputVectorSize = 1;
  if (this->_internal_inputvectorsize() != 0) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::UInt64SizePlusOne(this->_internal_inputvectorsize());
  }

  // uint64 outputVectorSize = 2;
  if (this->_internal_outputvectorsize() != 0) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::UInt64SizePlusOne(this->_internal_outputvectorsize());
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}